

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip32.cpp
# Opt level: O2

string * WriteHDKeypath_abi_cxx11_
                   (string *__return_storage_ptr__,
                   vector<unsigned_int,_std::allocator<unsigned_int>_> *keypath,bool apostrophe)

{
  long in_FS_OFFSET;
  string sStack_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  FormatHDKeypath_abi_cxx11_(&sStack_38,keypath,apostrophe);
  std::operator+(__return_storage_ptr__,"m",&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string WriteHDKeypath(const std::vector<uint32_t>& keypath, bool apostrophe)
{
    return "m" + FormatHDKeypath(keypath, apostrophe);
}